

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib571.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  void *__ptr;
  
  __stream = fopen64(libtest_arg2,"wb");
  if (__stream == (FILE *)0x0) {
    curl_mfprintf(_stderr,"Couldn\'t open the protocol dump file\n");
    return 0x7e;
  }
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    fclose(__stream);
    return 0x7e;
  }
  lVar2 = curl_easy_init();
  if (lVar2 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    fclose(__stream);
    curl_global_cleanup();
    return 0x7e;
  }
  iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
  __ptr = (void *)0x0;
  if (iVar1 != 0) goto LAB_001012ee;
  __ptr = (void *)curl_maprintf("%s%.4d",URL,1);
  if (__ptr == (void *)0x0) goto LAB_0010161e;
  iVar1 = curl_easy_setopt(lVar2,0x27cf,__ptr);
  if (iVar1 != 0) goto LAB_001012ee;
  free(__ptr);
  iVar1 = curl_easy_setopt(lVar2,0x4ee4,rtp_write);
  __ptr = (void *)0x0;
  if (iVar1 != 0) goto LAB_001012ee;
  iVar1 = curl_easy_setopt(lVar2,0xd,3);
  __ptr = (void *)0x0;
  if (iVar1 != 0) goto LAB_001012ee;
  iVar1 = curl_easy_setopt(lVar2,0x29,1);
  __ptr = (void *)0x0;
  if (iVar1 != 0) goto LAB_001012ee;
  iVar1 = curl_easy_setopt(lVar2,0x2711,__stream);
  __ptr = (void *)0x0;
  if (iVar1 != 0) goto LAB_001012ee;
  iVar1 = curl_easy_setopt(lVar2,0x27d0,"RTP/AVP/TCP;interleaved=0-1");
  __ptr = (void *)0x0;
  if (iVar1 != 0) goto LAB_001012ee;
  iVar1 = curl_easy_setopt(lVar2,0xbd,4);
  __ptr = (void *)0x0;
  if (iVar1 != 0) goto LAB_001012ee;
  iVar1 = curl_easy_perform(lVar2);
  if (iVar1 == 0) {
    __ptr = (void *)curl_maprintf("%s%.4d",URL,2);
    if (__ptr != (void *)0x0) {
      iVar1 = curl_easy_setopt(lVar2,0x27cf,__ptr);
      if (iVar1 != 0) goto LAB_001012ee;
      free(__ptr);
      iVar1 = curl_easy_setopt(lVar2,0xbd,5);
      __ptr = (void *)0x0;
      if (iVar1 != 0) goto LAB_001012ee;
      iVar1 = curl_easy_perform(lVar2);
      if (iVar1 != 0) goto LAB_00101448;
      __ptr = (void *)curl_maprintf("%s%.4d",URL,3);
      if (__ptr != (void *)0x0) {
        iVar1 = curl_easy_setopt(lVar2,0x27cf,__ptr);
        if (iVar1 != 0) goto LAB_001012ee;
        free(__ptr);
        iVar1 = curl_easy_setopt(lVar2,0xbd,2);
        __ptr = (void *)0x0;
        if (iVar1 != 0) goto LAB_001012ee;
        iVar1 = curl_easy_perform(lVar2);
        if (iVar1 != 0) goto LAB_00101448;
        __ptr = (void *)curl_maprintf("%s%.4d",URL,4);
        if (__ptr != (void *)0x0) {
          iVar1 = curl_easy_setopt(lVar2,0x27cf,__ptr);
          if (iVar1 == 0) {
            free(__ptr);
            iVar1 = curl_easy_setopt(lVar2,0xbd,5);
            __ptr = (void *)0x0;
            if (iVar1 == 0) {
              iVar1 = curl_easy_perform(lVar2);
              __ptr = (void *)0x0;
              if (iVar1 == 0) {
                curl_mfprintf(_stderr,"PLAY COMPLETE\n");
                if (rtp_packet_count < 0xd) {
                  do {
                    curl_mfprintf(_stderr,"LOOPY LOOP!\n");
                    iVar1 = curl_easy_setopt(lVar2,0xbd,0xb);
                    __ptr = (void *)0x0;
                    if ((iVar1 != 0) ||
                       (iVar1 = curl_easy_perform(lVar2), __ptr = (void *)0x0, iVar1 != 0)) break;
                  } while (rtp_packet_count < 0xd);
                }
                else {
                  __ptr = (void *)0x0;
                  iVar1 = 0;
                }
              }
            }
          }
          goto LAB_001012ee;
        }
      }
    }
LAB_0010161e:
    __ptr = (void *)0x0;
    iVar1 = 0x7e;
  }
  else {
LAB_00101448:
    __ptr = (void *)0x0;
  }
LAB_001012ee:
  free(__ptr);
  fclose(__stream);
  curl_easy_cleanup(lVar2);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int res;
  CURL *curl;
  char *stream_uri = NULL;
  int request = 1;

  FILE *protofile = fopen(libtest_arg2, "wb");
  if(protofile == NULL) {
    fprintf(stderr, "Couldn't open the protocol dump file\n");
    return TEST_ERR_MAJOR_BAD;
  }

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    fclose(protofile);
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    fclose(protofile);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  test_setopt(curl, CURLOPT_URL, URL);

  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;

  test_setopt(curl, CURLOPT_INTERLEAVEFUNCTION, rtp_write);
  test_setopt(curl, CURLOPT_TIMEOUT, 3L);
  test_setopt(curl, CURLOPT_VERBOSE, 1L);
  test_setopt(curl, CURLOPT_WRITEDATA, protofile);

  test_setopt(curl, CURLOPT_RTSP_TRANSPORT, "RTP/AVP/TCP;interleaved=0-1");
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_SETUP);

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  /* This PLAY starts the interleave */
  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_PLAY);

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  /* The DESCRIBE request will try to consume data after the Content */
  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_DESCRIBE);

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  stream_uri = suburl(URL, request++);
  if(!stream_uri) {
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, stream_uri);
  free(stream_uri);
  stream_uri = NULL;
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_PLAY);

  res = curl_easy_perform(curl);
  if(res)
    goto test_cleanup;

  fprintf(stderr, "PLAY COMPLETE\n");

  /* Use Receive to get the rest of the data */
  while(!res && rtp_packet_count < 13) {
    fprintf(stderr, "LOOPY LOOP!\n");
    test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_RECEIVE);
    res = curl_easy_perform(curl);
  }

test_cleanup:
  free(stream_uri);

  if(protofile)
    fclose(protofile);

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}